

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

WriterData * __thiscall
SafeQueue<WriterData>::pop(WriterData *__return_storage_ptr__,SafeQueue<WriterData> *this)

{
  uint8_t *puVar1;
  Commands CVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  reference pvVar6;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  SafeQueue<WriterData> *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mtx);
  pvVar6 = std::queue<WriterData,_std::deque<WriterData,_std::allocator<WriterData>_>_>::front
                     (&this->m_queue);
  puVar1 = pvVar6->m_buffer;
  iVar4 = pvVar6->m_bufferLen;
  uVar5 = *(undefined4 *)&pvVar6->field_0xc;
  CVar2 = pvVar6->m_command;
  uVar3 = *(undefined4 *)&pvVar6->field_0x1c;
  __return_storage_ptr__->m_mainFile = pvVar6->m_mainFile;
  __return_storage_ptr__->m_command = CVar2;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar3;
  __return_storage_ptr__->m_buffer = puVar1;
  __return_storage_ptr__->m_bufferLen = iVar4;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar5;
  std::queue<WriterData,_std::deque<WriterData,_std::allocator<WriterData>_>_>::pop(&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return __return_storage_ptr__;
}

Assistant:

virtual T pop()
    {
        std::lock_guard lk(m_mtx);

        T val = m_queue.front();
        m_queue.pop();

        return val;
    }